

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.h
# Opt level: O1

void __thiscall sing::HttpRequest::reset(HttpRequest *this)

{
  this->method = Invalid;
  this->version = Unknown;
  std::__cxx11::string::_M_replace
            ((ulong)&this->path,0,(char *)(this->path)._M_string_length,0x111459);
  std::__cxx11::string::_M_replace
            ((ulong)&this->query,0,(char *)(this->query)._M_string_length,0x111459);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->headers)._M_t);
  return;
}

Assistant:

void reset(){
        method = Invalid;
        version = Unknown;
        path = "";
        query = "";
        headers.clear();
    }